

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O3

void __thiscall
Lib::Map<Kernel::Variable,_Inferences::FlatMeetLattice<int>,_Lib::StlHash>::expand
          (Map<Kernel::Variable,_Inferences::FlatMeetLattice<int>,_Lib::StlHash> *this)

{
  long lVar1;
  int iVar2;
  Entry *pEVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Entry *p;
  Entry *pEVar7;
  long lVar8;
  void **head;
  int iVar9;
  Entry *pEVar10;
  ulong uVar11;
  int iVar13;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  int iVar16;
  undefined1 auVar15 [16];
  
  iVar2 = this->_capacity;
  iVar9 = 0x20;
  if ((long)iVar2 != 0) {
    iVar9 = iVar2 * 2;
  }
  this->_capacity = iVar9;
  pEVar3 = this->_entries;
  if (iVar9 == 0) {
    pEVar7 = (Entry *)FixedSizeAllocator<8UL>::alloc
                                ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
  }
  else {
    uVar11 = (long)iVar9 * 0x10;
    if (uVar11 < 0x21) {
      pEVar7 = (Entry *)FixedSizeAllocator<32UL>::alloc
                                  ((FixedSizeAllocator<32UL> *)
                                   (GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    }
    else if (uVar11 < 0x31) {
      pEVar7 = (Entry *)FixedSizeAllocator<48UL>::alloc
                                  ((FixedSizeAllocator<48UL> *)
                                   (GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    }
    else if (uVar11 < 0x41) {
      pEVar7 = (Entry *)FixedSizeAllocator<64UL>::alloc
                                  ((FixedSizeAllocator<64UL> *)
                                   (GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    }
    else {
      pEVar7 = (Entry *)::operator_new(uVar11,0x10);
    }
  }
  auVar6 = _DAT_0084f040;
  auVar5 = _DAT_0084f030;
  auVar4 = _DAT_0084f020;
  iVar9 = this->_capacity;
  lVar8 = (long)iVar9;
  if (lVar8 != 0) {
    lVar1 = lVar8 + -1;
    auVar12._8_4_ = (int)lVar1;
    auVar12._0_8_ = lVar1;
    auVar12._12_4_ = (int)((ulong)lVar1 >> 0x20);
    pEVar10 = pEVar7 + 3;
    uVar11 = 0;
    auVar12 = auVar12 ^ _DAT_0084f040;
    do {
      auVar14._8_4_ = (int)uVar11;
      auVar14._0_8_ = uVar11;
      auVar14._12_4_ = (int)(uVar11 >> 0x20);
      auVar15 = (auVar14 | auVar5) ^ auVar6;
      iVar13 = auVar12._4_4_;
      if ((bool)(~(auVar15._4_4_ == iVar13 && auVar12._0_4_ < auVar15._0_4_ ||
                  iVar13 < auVar15._4_4_) & 1)) {
        pEVar10[-3].code = 0;
      }
      if ((auVar15._12_4_ != auVar12._12_4_ || auVar15._8_4_ <= auVar12._8_4_) &&
          auVar15._12_4_ <= auVar12._12_4_) {
        pEVar10[-2].code = 0;
      }
      auVar14 = (auVar14 | auVar4) ^ auVar6;
      iVar16 = auVar14._4_4_;
      if (iVar16 <= iVar13 && (iVar16 != iVar13 || auVar14._0_4_ <= auVar12._0_4_)) {
        pEVar10[-1].code = 0;
        pEVar10->code = 0;
      }
      uVar11 = uVar11 + 4;
      pEVar10 = pEVar10 + 4;
    } while ((lVar8 + 3U & 0xfffffffffffffffc) != uVar11);
  }
  this->_entries = pEVar7;
  this->_afterLast = pEVar7 + lVar8;
  this->_maxEntries = (int)((double)iVar9 * 0.8);
  iVar9 = this->_noOfEntries;
  this->_noOfEntries = 0;
  pEVar7 = pEVar3;
  for (; iVar9 != 0; iVar9 = iVar9 + -1) {
    do {
      pEVar10 = pEVar7;
      pEVar7 = pEVar10 + 1;
    } while (pEVar10->code == 0);
    insert(this,(Variable *)&(pEVar10->_key).__align,
           (FlatMeetLattice<int> *)&(pEVar10->_value).__align,pEVar10->code);
  }
  if (pEVar3 != (Entry *)0x0) {
    if (iVar2 == 0) {
      pEVar3->code = (int)GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      pEVar3->_key = (MaybeUninit<Kernel::Variable>)SUB84(GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_,4);
      GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pEVar3;
    }
    else {
      uVar11 = (long)iVar2 * 0x10;
      if (uVar11 < 0x11) {
        pEVar3->code = (int)GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        pEVar3->_key = (MaybeUninit<Kernel::Variable>)SUB84(GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_,4);
        GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pEVar3;
      }
      else if (uVar11 < 0x19) {
        pEVar3->code = (int)GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        pEVar3->_key = (MaybeUninit<Kernel::Variable>)SUB84(GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_,4);
        GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pEVar3;
      }
      else if (uVar11 < 0x21) {
        pEVar3->code = (int)GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        pEVar3->_key = (MaybeUninit<Kernel::Variable>)SUB84(GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_,4);
        GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pEVar3;
      }
      else if (uVar11 < 0x31) {
        pEVar3->code = (int)GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        pEVar3->_key = (MaybeUninit<Kernel::Variable>)SUB84(GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_,4)
        ;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pEVar3;
      }
      else {
        if (0x40 < uVar11) {
          operator_delete(pEVar3,0x10);
          return;
        }
        pEVar3->code = (int)GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        pEVar3->_key = (MaybeUninit<Kernel::Variable>)SUB84(GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_,4)
        ;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pEVar3;
      }
    }
  }
  return;
}

Assistant:

void expand()
  {
    size_t oldCapacity = _capacity;
    _capacity = _capacity ? _capacity * 2 : 32;

    Entry* oldEntries = _entries;

    void* mem = ALLOC_KNOWN(sizeof(Entry)*_capacity,"Map<>");
    _entries = array_new<Entry>(mem, _capacity);

    _afterLast = _entries + _capacity;
    _maxEntries = (int)(_capacity * 0.8);
    // experiments using (a) random numbers (b) consecutive numbers
    // and (1) int->int 20M allocations (2) string->int 10M allocations
    // and 30,000,000 allocations
    // 0.6 : 6.80 4.87 20.8 14.9 32.6 14
    // 0.7 : 6.58 5.61 23.1 15.2 35.2 16.6
    // 0.8 : 6.36 5.77 24.0 15.4 36.0 17.4
    // 0.9 : 7.54 6.04 25.4 15.2 37.0 18.4
    // copy old entries
    Entry* current = oldEntries;
    int remaining = _noOfEntries;
    _noOfEntries = 0;
    while (remaining != 0) {
      // find first occupied entry
      while (! current->occupied()) {
        current ++;
      }
      // now current is occupied
      insert(std::move(current->key()),std::move(current->value()),current->code);
      current ++;
      remaining --;
    }
    if (oldEntries) {
      array_delete(oldEntries, oldCapacity);
      DEALLOC_KNOWN(oldEntries,sizeof(Entry)*oldCapacity,"Map<>");
    }
  }